

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

char * CalcWordWrapNextLineStartA(char *text,char *text_end)

{
  char cVar1;
  
  for (; (cVar1 = *text, text < text_end && ((cVar1 == ' ' || (cVar1 == '\t')))); text = text + 1) {
  }
  return text + (cVar1 == '\n');
}

Assistant:

static inline const char* CalcWordWrapNextLineStartA(const char* text, const char* text_end)
{
    while (text < text_end && ImCharIsBlankA(*text))
        text++;
    if (*text == '\n')
        text++;
    return text;
}